

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

void __thiscall
Parser::printError<std::__cxx11::string>
          (Parser *this,Token *token,char *text,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string sStack_38;
  
  tinyformat::format<std::__cxx11::string>(&sStack_38,(tinyformat *)text,(char *)args,args);
  printError(this,token,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void printError(const Token& token, const char* text, const Args&... args)
	{
		printError(token, tfm::format(text,args...));
	}